

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_disk_entry_from_file.c
# Opt level: O0

wchar_t setup_sparse(archive_read_disk *a,archive_entry *entry)

{
  wchar_t wVar1;
  void *pvVar2;
  la_int64_t lVar3;
  int local_3c;
  int64_t iStack_38;
  wchar_t i;
  int64_t offset;
  int64_t length;
  tree *t;
  archive_entry *entry_local;
  archive_read_disk *a_local;
  
  length = (int64_t)a->tree;
  t = (tree *)entry;
  entry_local = (archive_entry *)a;
  wVar1 = archive_entry_sparse_reset(entry);
  *(wchar_t *)(length + 0x1e8) = wVar1;
  if (*(int *)(length + 0x1ec) < *(int *)(length + 0x1e8) + 1) {
    free(*(void **)(length + 0x1d8));
    *(int *)(length + 0x1ec) = *(int *)(length + 0x1e8) + 1;
    pvVar2 = malloc((long)*(int *)(length + 0x1ec) << 4);
    *(void **)(length + 0x1d8) = pvVar2;
    if (*(long *)(length + 0x1d8) == 0) {
      *(undefined4 *)(length + 0x1ec) = 0;
      archive_set_error((archive *)entry_local,0xc,"Can\'t allocate data");
      *(undefined4 *)((long)&entry_local->archive + 4) = 0x8000;
      return L'\xffffffe2';
    }
  }
  for (local_3c = 0; local_3c < *(int *)(length + 0x1e8); local_3c = local_3c + 1) {
    archive_entry_sparse_next((archive_entry *)t,&stack0xffffffffffffffc8,&offset);
    *(int64_t *)(*(long *)(length + 0x1d8) + (long)local_3c * 0x10 + 8) = iStack_38;
    *(int64_t *)(*(long *)(length + 0x1d8) + (long)local_3c * 0x10) = offset;
  }
  if (local_3c == 0) {
    *(undefined8 *)(*(long *)(length + 0x1d8) + 8) = 0;
    lVar3 = archive_entry_size((archive_entry *)t);
    **(la_int64_t **)(length + 0x1d8) = lVar3;
  }
  else {
    lVar3 = archive_entry_size((archive_entry *)t);
    *(la_int64_t *)(*(long *)(length + 0x1d8) + (long)local_3c * 0x10 + 8) = lVar3;
    *(undefined8 *)(*(long *)(length + 0x1d8) + (long)local_3c * 0x10) = 0;
  }
  *(undefined8 *)(length + 0x1e0) = *(undefined8 *)(length + 0x1d8);
  return L'\0';
}

Assistant:

static int
setup_sparse(struct archive_read_disk *a,
    struct archive_entry *entry, int *fd)
{
	char buff[4096];
	struct fiemap *fm;
	struct fiemap_extent *fe;
	int64_t size;
	int count, do_fiemap;
	int exit_sts = ARCHIVE_OK;

	if (archive_entry_filetype(entry) != AE_IFREG
	    || archive_entry_size(entry) <= 0
	    || archive_entry_hardlink(entry) != NULL)
		return (ARCHIVE_OK);

	if (*fd < 0) {
		const char *path;

		path = archive_entry_sourcepath(entry);
		if (path == NULL)
			path = archive_entry_pathname(entry);
		if (a->tree != NULL)
			*fd = a->open_on_current_dir(a->tree, path,
				O_RDONLY | O_NONBLOCK | O_CLOEXEC);
		else
			*fd = open(path, O_RDONLY | O_NONBLOCK | O_CLOEXEC);
		if (*fd < 0) {
			archive_set_error(&a->archive, errno,
			    "Can't open `%s'", path);
			return (ARCHIVE_FAILED);
		}
		__archive_ensure_cloexec_flag(*fd);
	}

	/* Initialize buffer to avoid the error valgrind complains about. */
	memset(buff, 0, sizeof(buff));
	count = (sizeof(buff) - sizeof(*fm))/sizeof(*fe);
	fm = (struct fiemap *)buff;
	fm->fm_start = 0;
	fm->fm_length = ~0ULL;;
	fm->fm_flags = FIEMAP_FLAG_SYNC;
	fm->fm_extent_count = count;
	do_fiemap = 1;
	size = archive_entry_size(entry);
	for (;;) {
		int i, r;

		r = ioctl(*fd, FS_IOC_FIEMAP, fm); 
		if (r < 0) {
			/* When something error happens, it is better we
			 * should return ARCHIVE_OK because an earlier
			 * version(<2.6.28) cannot perfom FS_IOC_FIEMAP. */
			goto exit_setup_sparse;
		}
		if (fm->fm_mapped_extents == 0)
			break;
		fe = fm->fm_extents;
		for (i = 0; i < (int)fm->fm_mapped_extents; i++, fe++) {
			if (!(fe->fe_flags & FIEMAP_EXTENT_UNWRITTEN)) {
				/* The fe_length of the last block does not
				 * adjust itself to its size files. */
				int64_t length = fe->fe_length;
				if (fe->fe_logical + length > (uint64_t)size)
					length -= fe->fe_logical + length - size;
				if (fe->fe_logical == 0 && length == size) {
					/* This is not sparse. */
					do_fiemap = 0;
					break;
				}
				if (length > 0)
					archive_entry_sparse_add_entry(entry,
					    fe->fe_logical, length);
			}
			if (fe->fe_flags & FIEMAP_EXTENT_LAST)
				do_fiemap = 0;
		}
		if (do_fiemap) {
			fe = fm->fm_extents + fm->fm_mapped_extents -1;
			fm->fm_start = fe->fe_logical + fe->fe_length;
		} else
			break;
	}
exit_setup_sparse:
	return (exit_sts);
}